

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_36::HttpClientAdapter::ConnectResponseImpl::~ConnectResponseImpl
          (ConnectResponseImpl *this)

{
  PromiseFulfiller<kj::HttpClient::ConnectRequest::Status> *pPVar1;
  PromiseFulfiller<void> *pPVar2;
  Disposer *pDVar3;
  AsyncIoStream *pAVar4;
  char *pcVar5;
  size_t sVar6;
  int iVar7;
  char (*in_RCX) [70];
  Exception ex;
  String local_358;
  Exception local_338;
  Exception local_1a8;
  
  iVar7 = (*(((this->fulfiller).ptr)->super_PromiseRejector)._vptr_PromiseRejector[1])();
  if ((char)iVar7 == '\0') {
    iVar7 = (*(((this->streamAndFulfiller).fulfiller.ptr)->super_PromiseRejector).
              _vptr_PromiseRejector[1])();
    if ((char)iVar7 == '\0') goto LAB_0041fe87;
  }
  kj::_::Debug::makeDescription<char_const(&)[70]>
            (&local_358,
             (Debug *)"\"service\'s connect() implementation never called accept() nor reject()\"",
             "service\'s connect() implementation never called accept() nor reject()",in_RCX);
  Exception::Exception
            (&local_338,FAILED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1bca,&local_358);
  sVar6 = local_358.content.size_;
  pcVar5 = local_358.content.ptr;
  if (local_358.content.ptr != (char *)0x0) {
    local_358.content.ptr = (char *)0x0;
    local_358.content.size_ = 0;
    (**(local_358.content.disposer)->_vptr_ArrayDisposer)
              (local_358.content.disposer,pcVar5,1,sVar6,sVar6,0);
  }
  iVar7 = (*(((this->fulfiller).ptr)->super_PromiseRejector)._vptr_PromiseRejector[1])();
  if ((char)iVar7 != '\0') {
    pPVar1 = (this->fulfiller).ptr;
    Exception::Exception(&local_1a8,&local_338);
    (**(pPVar1->super_PromiseRejector)._vptr_PromiseRejector)(pPVar1,&local_1a8);
    Exception::~Exception(&local_1a8);
  }
  iVar7 = (*(((this->streamAndFulfiller).fulfiller.ptr)->super_PromiseRejector).
            _vptr_PromiseRejector[1])();
  if ((char)iVar7 != '\0') {
    pPVar2 = (this->streamAndFulfiller).fulfiller.ptr;
    (**(pPVar2->super_PromiseRejector)._vptr_PromiseRejector)(pPVar2,&local_338);
  }
  Exception::~Exception(&local_338);
LAB_0041fe87:
  pPVar2 = (this->streamAndFulfiller).fulfiller.ptr;
  if (pPVar2 != (PromiseFulfiller<void> *)0x0) {
    (this->streamAndFulfiller).fulfiller.ptr = (PromiseFulfiller<void> *)0x0;
    pDVar3 = (this->streamAndFulfiller).fulfiller.disposer;
    (**pDVar3->_vptr_Disposer)
              (pDVar3,(pPVar2->super_PromiseRejector)._vptr_PromiseRejector[-2] +
                      (long)&(pPVar2->super_PromiseRejector)._vptr_PromiseRejector);
  }
  pAVar4 = (this->streamAndFulfiller).guarded.ptr;
  if (pAVar4 != (AsyncIoStream *)0x0) {
    (this->streamAndFulfiller).guarded.ptr = (AsyncIoStream *)0x0;
    pDVar3 = (this->streamAndFulfiller).guarded.disposer;
    (**pDVar3->_vptr_Disposer)
              (pDVar3,(pAVar4->super_AsyncInputStream)._vptr_AsyncInputStream[-2] +
                      (long)&(pAVar4->super_AsyncInputStream)._vptr_AsyncInputStream);
  }
  pPVar1 = (this->fulfiller).ptr;
  if (pPVar1 != (PromiseFulfiller<kj::HttpClient::ConnectRequest::Status> *)0x0) {
    (this->fulfiller).ptr = (PromiseFulfiller<kj::HttpClient::ConnectRequest::Status> *)0x0;
    pDVar3 = (this->fulfiller).disposer;
    (**pDVar3->_vptr_Disposer)
              (pDVar3,(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[-2] +
                      (long)&(pPVar1->super_PromiseRejector)._vptr_PromiseRejector);
  }
  Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

~ConnectResponseImpl() noexcept(false) {
      if (fulfiller->isWaiting() || streamAndFulfiller.fulfiller->isWaiting()) {
        auto ex = KJ_EXCEPTION(FAILED,
            "service's connect() implementation never called accept() nor reject()");
        if (fulfiller->isWaiting()) {
          fulfiller->reject(kj::cp(ex));
        }
        if (streamAndFulfiller.fulfiller->isWaiting()) {
          streamAndFulfiller.fulfiller->reject(kj::mv(ex));
        }
      }
    }